

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.cc
# Opt level: O0

StatusOr<std::unique_ptr<draco::MeshDecoder,_std::default_delete<draco::MeshDecoder>_>_> *
draco::CreateMeshDecoder(uint8_t method)

{
  char in_SIL;
  StatusOr<std::unique_ptr<draco::MeshDecoder,_std::default_delete<draco::MeshDecoder>_>_> *in_RDI;
  pointer in_stack_ffffffffffffff48;
  Status *status;
  MeshEdgebreakerDecoder *in_stack_ffffffffffffff50;
  StatusOr<std::unique_ptr<draco::MeshDecoder,_std::default_delete<draco::MeshDecoder>_>_> *this;
  unique_ptr<draco::MeshDecoder,_std::default_delete<draco::MeshDecoder>_>
  *in_stack_ffffffffffffff60;
  unique_ptr<draco::MeshDecoder,_std::default_delete<draco::MeshDecoder>_> *this_00;
  allocator<char> *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  undefined1 local_30 [48];
  
  if (in_SIL == '\0') {
    operator_new(0x60);
    MeshSequentialDecoder::MeshSequentialDecoder((MeshSequentialDecoder *)in_stack_ffffffffffffff50)
    ;
    this_00 = (unique_ptr<draco::MeshDecoder,_std::default_delete<draco::MeshDecoder>_> *)
              (local_30 + 0x18);
    std::unique_ptr<draco::MeshDecoder,std::default_delete<draco::MeshDecoder>>::
    unique_ptr<std::default_delete<draco::MeshDecoder>,void>
              ((unique_ptr<draco::MeshDecoder,_std::default_delete<draco::MeshDecoder>_> *)
               in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    StatusOr<std::unique_ptr<draco::MeshDecoder,_std::default_delete<draco::MeshDecoder>_>_>::
    StatusOr((StatusOr<std::unique_ptr<draco::MeshDecoder,_std::default_delete<draco::MeshDecoder>_>_>
              *)in_stack_ffffffffffffff50,
             (unique_ptr<draco::MeshDecoder,_std::default_delete<draco::MeshDecoder>_> *)
             in_stack_ffffffffffffff48);
    std::unique_ptr<draco::MeshDecoder,_std::default_delete<draco::MeshDecoder>_>::~unique_ptr
              (this_00);
  }
  else if (in_SIL == '\x01') {
    operator_new(0x68);
    MeshEdgebreakerDecoder::MeshEdgebreakerDecoder(in_stack_ffffffffffffff50);
    this = (StatusOr<std::unique_ptr<draco::MeshDecoder,_std::default_delete<draco::MeshDecoder>_>_>
            *)local_30;
    std::unique_ptr<draco::MeshDecoder,std::default_delete<draco::MeshDecoder>>::
    unique_ptr<std::default_delete<draco::MeshDecoder>,void>
              ((unique_ptr<draco::MeshDecoder,_std::default_delete<draco::MeshDecoder>_> *)this,
               in_stack_ffffffffffffff48);
    StatusOr<std::unique_ptr<draco::MeshDecoder,_std::default_delete<draco::MeshDecoder>_>_>::
    StatusOr(this,(unique_ptr<draco::MeshDecoder,_std::default_delete<draco::MeshDecoder>_> *)
                  in_stack_ffffffffffffff48);
    std::unique_ptr<draco::MeshDecoder,_std::default_delete<draco::MeshDecoder>_>::~unique_ptr
              (in_stack_ffffffffffffff60);
  }
  else {
    status = (Status *)&stack0xffffffffffffff87;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    Status::Status((Status *)in_stack_ffffffffffffff50,(Code)((ulong)status >> 0x20),
                   (string *)0x152dab);
    StatusOr<std::unique_ptr<draco::MeshDecoder,_std::default_delete<draco::MeshDecoder>_>_>::
    StatusOr((StatusOr<std::unique_ptr<draco::MeshDecoder,_std::default_delete<draco::MeshDecoder>_>_>
              *)in_stack_ffffffffffffff50,status);
    Status::~Status((Status *)0x152dc8);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff88);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff87);
  }
  return in_RDI;
}

Assistant:

StatusOr<std::unique_ptr<MeshDecoder>> CreateMeshDecoder(uint8_t method) {
  if (method == MESH_SEQUENTIAL_ENCODING) {
    return std::unique_ptr<MeshDecoder>(new MeshSequentialDecoder());
  } else if (method == MESH_EDGEBREAKER_ENCODING) {
    return std::unique_ptr<MeshDecoder>(new MeshEdgebreakerDecoder());
  }
  return Status(Status::DRACO_ERROR, "Unsupported encoding method.");
}